

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O1

void __thiscall
cppcms::xss::rules::add_uri_property(rules *this,string *tag_name,string *property,string *schema)

{
  data *pdVar1;
  data *pdVar2;
  _Any_data local_40;
  code *local_30;
  
  uri_validator((validator_type *)&local_40,schema,false);
  pdVar1 = (this->d).ptr_;
  pdVar2 = (data *)&pdVar1->html_rules;
  if (pdVar1->is_xhtml != false) {
    pdVar2 = pdVar1;
  }
  (*(pdVar2->xhtml_rules).super_basic_rules_holder._vptr_basic_rules_holder[1])
            (pdVar2,tag_name,property,&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void rules::add_uri_property(std::string const &tag_name,std::string const &property,std::string const &schema)
	{
		add_property(tag_name,property,uri_validator(schema));
	}